

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  ostream *poVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  int iVar5;
  TablePrinter *pTVar6;
  allocator_type *in_RCX;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  long lVar7;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l_00;
  allocator<char> local_10c;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  local_108;
  ColumnInfo local_e8;
  string local_b8 [32];
  undefined8 local_98;
  undefined4 local_90;
  string local_88 [32];
  undefined8 local_68;
  undefined4 local_60;
  string local_58 [32];
  undefined8 local_38;
  undefined4 local_30;
  
  StreamingReporterBase::StreamingReporterBase(&this->super_StreamingReporterBase,config);
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__ConsoleReporter_002f45e8;
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  iVar5 = (*config->m_fullConfig->_vptr_IConfig[0x18])();
  if ((char)iVar5 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"benchmark name",&local_109);
    local_e8.width = 0x25;
    local_e8.justification = Left;
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"samples      mean       std dev",&local_10a);
    local_98 = 0xe;
    local_90 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_88,"iterations   low mean   low std dev",&local_10b);
    local_68 = 0xe;
    local_60 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,"estimated    high mean  high std dev",&local_10c);
    local_38 = 0xe;
    local_30 = 1;
    __l_00._M_len = extraout_RDX_00;
    __l_00._M_array = &local_e8;
    std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_108,__l_00,in_RCX);
    lVar7 = 0x90;
    do {
      std::__cxx11::string::~string((string *)((long)&local_e8.name._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != -0x30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"benchmark name",&local_109);
    local_e8.width = 0x25;
    local_e8.justification = Left;
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"     samples",&local_10a);
    local_98 = 0xe;
    local_90 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_88,"  iterations",&local_10b);
    local_68 = 0xe;
    local_60 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_58,"        mean",&local_10c);
    local_38 = 0xe;
    local_30 = 1;
    __l._M_len = extraout_RDX;
    __l._M_array = &local_e8;
    std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_108,__l,in_RCX);
    lVar7 = 0x90;
    do {
      std::__cxx11::string::~string((string *)((long)&local_e8.name._M_dataplus._M_p + lVar7));
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != -0x30);
  }
  pTVar6 = (TablePrinter *)operator_new(0x38);
  pCVar4 = local_108.
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pCVar3 = local_108.
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = local_108.
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_108.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar6->m_os = poVar1;
  (pTVar6->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = pCVar2;
  (pTVar6->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = pCVar3;
  local_e8.name.field_2._M_allocated_capacity = 0;
  (pTVar6->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar4;
  local_e8.name._M_dataplus._M_p = (pointer)0x0;
  local_e8.name._M_string_length = 0;
  ReusableStringStream::ReusableStringStream(&pTVar6->m_oss);
  pTVar6->m_currentColumn = -1;
  pTVar6->m_isOpen = false;
  (this->m_tablePrinter).m_ptr = pTVar6;
  std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             *)&local_e8);
  std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector(&local_108);
  this->m_headerPrinted = false;
  this->m_testRunInfoPrinted = false;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig&& config):
    StreamingReporterBase( CATCH_MOVE( config ) ),
    m_tablePrinter(Detail::make_unique<TablePrinter>(m_stream,
        [&config]() -> std::vector<ColumnInfo> {
        if (config.fullConfig()->benchmarkNoAnalysis())
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                { "     samples", 14, Justification::Right },
                { "  iterations", 14, Justification::Right },
                { "        mean", 14, Justification::Right }
            };
        }
        else
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, Justification::Left },
                { "samples      mean       std dev", 14, Justification::Right },
                { "iterations   low mean   low std dev", 14, Justification::Right },
                { "estimated    high mean  high std dev", 14, Justification::Right }
            };
        }
    }())) {}